

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

void stbi__idct_block(stbi_uc *out,int out_stride,short *data)

{
  stbi_uc sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  short *in_RDX;
  int in_ESI;
  stbi_uc *in_RDI;
  int x3_1;
  int x2_1;
  int x1_1;
  int x0_1;
  int p5_1;
  int p4_1;
  int p3_1;
  int p2_1;
  int p1_1;
  int t3_1;
  int t2_1;
  int t1_1;
  int t0_1;
  int x3;
  int x2;
  int x1;
  int x0;
  int p5;
  int p4;
  int p3;
  int p2;
  int p1;
  int t3;
  int t2;
  int t1;
  int t0;
  int dcterm;
  short *d;
  stbi_uc *o;
  int *v;
  int val [64];
  int i;
  short *local_140;
  stbi_uc *local_138;
  int *local_130;
  int local_128 [8];
  int local_108 [8];
  int local_e8 [8];
  int local_c8 [8];
  int local_a8 [8];
  int local_88 [8];
  int local_68 [8];
  int local_48 [11];
  int local_1c;
  int local_c;
  stbi_uc *local_8;
  
  local_130 = local_128;
  local_140 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    if ((((local_140[8] == 0) && (local_140[0x10] == 0)) && (local_140[0x18] == 0)) &&
       (((local_140[0x20] == 0 && (local_140[0x28] == 0)) &&
        ((local_140[0x30] == 0 && (local_140[0x38] == 0)))))) {
      iVar2 = (int)*local_140 << 2;
      local_130[0x38] = iVar2;
      local_130[0x30] = iVar2;
      local_130[0x28] = iVar2;
      local_130[0x20] = iVar2;
      local_130[0x18] = iVar2;
      local_130[0x10] = iVar2;
      local_130[8] = iVar2;
      *local_130 = iVar2;
    }
    else {
      iVar3 = ((int)local_140[0x10] + (int)local_140[0x30]) * 0x8a9;
      iVar2 = iVar3 + local_140[0x30] * -0x1d8f;
      iVar3 = iVar3 + local_140[0x10] * 0xc3f;
      iVar4 = ((int)*local_140 + (int)local_140[0x20]) * 0x1000;
      iVar5 = ((int)*local_140 - (int)local_140[0x20]) * 0x1000;
      iVar6 = (int)local_140[0x38];
      iVar7 = (int)local_140[0x28];
      iVar8 = (int)local_140[0x18];
      iVar9 = (int)local_140[8];
      iVar10 = (iVar6 + iVar8 + iVar7 + iVar9) * 0x12d0;
      iVar11 = iVar10 + (iVar6 + iVar9) * -0xe65;
      iVar10 = iVar10 + (iVar7 + iVar8) * -0x2901;
      iVar12 = (iVar6 + iVar8) * -0x1f62;
      iVar13 = (iVar7 + iVar9) * -0x63d;
      iVar9 = iVar11 + iVar13 + iVar9 * 0x1805;
      iVar8 = iVar10 + iVar12 + iVar8 * 0x312a;
      iVar7 = iVar10 + iVar13 + iVar7 * 0x20da;
      iVar6 = iVar11 + iVar12 + iVar6 * 0x4c7;
      iVar11 = iVar4 + iVar3 + 0x200;
      iVar10 = iVar5 + iVar2 + 0x200;
      iVar2 = (iVar5 - iVar2) + 0x200;
      iVar3 = (iVar4 - iVar3) + 0x200;
      *local_130 = iVar11 + iVar9 >> 10;
      local_130[0x38] = iVar11 - iVar9 >> 10;
      local_130[8] = iVar10 + iVar8 >> 10;
      local_130[0x30] = iVar10 - iVar8 >> 10;
      local_130[0x10] = iVar2 + iVar7 >> 10;
      local_130[0x28] = iVar2 - iVar7 >> 10;
      local_130[0x18] = iVar3 + iVar6 >> 10;
      local_130[0x20] = iVar3 - iVar6 >> 10;
    }
    local_140 = local_140 + 1;
    local_130 = local_130 + 1;
  }
  local_130 = local_128;
  local_138 = local_8;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    iVar7 = (local_130[2] + local_130[6]) * 0x8a9;
    iVar6 = iVar7 + local_130[6] * -0x1d8f;
    iVar7 = iVar7 + local_130[2] * 0xc3f;
    iVar8 = (*local_130 + local_130[4]) * 0x1000;
    iVar9 = (*local_130 - local_130[4]) * 0x1000;
    iVar2 = local_130[7];
    iVar3 = local_130[5];
    iVar4 = local_130[3];
    iVar5 = local_130[1];
    iVar10 = (iVar2 + iVar4 + iVar3 + iVar5) * 0x12d0;
    iVar11 = iVar10 + (iVar2 + iVar5) * -0xe65;
    iVar10 = iVar10 + (iVar3 + iVar4) * -0x2901;
    iVar12 = (iVar2 + iVar4) * -0x1f62;
    iVar13 = (iVar3 + iVar5) * -0x63d;
    iVar5 = iVar11 + iVar13 + iVar5 * 0x1805;
    iVar4 = iVar10 + iVar12 + iVar4 * 0x312a;
    iVar3 = iVar10 + iVar13 + iVar3 * 0x20da;
    iVar2 = iVar11 + iVar12 + iVar2 * 0x4c7;
    iVar11 = iVar8 + iVar7 + 0x1010000;
    iVar10 = iVar9 + iVar6 + 0x1010000;
    iVar6 = (iVar9 - iVar6) + 0x1010000;
    iVar7 = (iVar8 - iVar7) + 0x1010000;
    sVar1 = stbi__clamp(iVar11 + iVar5 >> 0x11);
    *local_138 = sVar1;
    sVar1 = stbi__clamp(iVar11 - iVar5 >> 0x11);
    local_138[7] = sVar1;
    sVar1 = stbi__clamp(iVar10 + iVar4 >> 0x11);
    local_138[1] = sVar1;
    sVar1 = stbi__clamp(iVar10 - iVar4 >> 0x11);
    local_138[6] = sVar1;
    sVar1 = stbi__clamp(iVar6 + iVar3 >> 0x11);
    local_138[2] = sVar1;
    sVar1 = stbi__clamp(iVar6 - iVar3 >> 0x11);
    local_138[5] = sVar1;
    sVar1 = stbi__clamp(iVar7 + iVar2 >> 0x11);
    local_138[3] = sVar1;
    sVar1 = stbi__clamp(iVar7 - iVar2 >> 0x11);
    local_138[4] = sVar1;
    local_130 = local_130 + 8;
    local_138 = local_138 + local_c;
  }
  return;
}

Assistant:

static void stbi__idct_block(stbi_uc *out, int out_stride, short data[64])
{
   int i,val[64],*v=val;
   stbi_uc *o;
   short *d = data;

   // columns
   for (i=0; i < 8; ++i,++d, ++v) {
      // if all zeroes, shortcut -- this avoids dequantizing 0s and IDCTing
      if (d[ 8]==0 && d[16]==0 && d[24]==0 && d[32]==0
           && d[40]==0 && d[48]==0 && d[56]==0) {
         //    no shortcut                 0     seconds
         //    (1|2|3|4|5|6|7)==0          0     seconds
         //    all separate               -0.047 seconds
         //    1 && 2|3 && 4|5 && 6|7:    -0.047 seconds
         int dcterm = d[0]*4;
         v[0] = v[8] = v[16] = v[24] = v[32] = v[40] = v[48] = v[56] = dcterm;
      } else {
         STBI__IDCT_1D(d[ 0],d[ 8],d[16],d[24],d[32],d[40],d[48],d[56])
         // constants scaled things up by 1<<12; let's bring them back
         // down, but keep 2 extra bits of precision
         x0 += 512; x1 += 512; x2 += 512; x3 += 512;
         v[ 0] = (x0+t3) >> 10;
         v[56] = (x0-t3) >> 10;
         v[ 8] = (x1+t2) >> 10;
         v[48] = (x1-t2) >> 10;
         v[16] = (x2+t1) >> 10;
         v[40] = (x2-t1) >> 10;
         v[24] = (x3+t0) >> 10;
         v[32] = (x3-t0) >> 10;
      }
   }

   for (i=0, v=val, o=out; i < 8; ++i,v+=8,o+=out_stride) {
      // no fast case since the first 1D IDCT spread components out
      STBI__IDCT_1D(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7])
      // constants scaled things up by 1<<12, plus we had 1<<2 from first
      // loop, plus horizontal and vertical each scale by sqrt(8) so together
      // we've got an extra 1<<3, so 1<<17 total we need to remove.
      // so we want to round that, which means adding 0.5 * 1<<17,
      // aka 65536. Also, we'll end up with -128 to 127 that we want
      // to encode as 0..255 by adding 128, so we'll add that before the shift
      x0 += 65536 + (128<<17);
      x1 += 65536 + (128<<17);
      x2 += 65536 + (128<<17);
      x3 += 65536 + (128<<17);
      // tried computing the shifts into temps, or'ing the temps to see
      // if any were out of range, but that was slower
      o[0] = stbi__clamp((x0+t3) >> 17);
      o[7] = stbi__clamp((x0-t3) >> 17);
      o[1] = stbi__clamp((x1+t2) >> 17);
      o[6] = stbi__clamp((x1-t2) >> 17);
      o[2] = stbi__clamp((x2+t1) >> 17);
      o[5] = stbi__clamp((x2-t1) >> 17);
      o[3] = stbi__clamp((x3+t0) >> 17);
      o[4] = stbi__clamp((x3-t0) >> 17);
   }
}